

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
::dx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  double *pdVar3;
  value_type vVar4;
  value_type vVar5;
  
  pFVar2 = this->left_;
  pdVar3 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar3 = (pFVar2->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar3;
  vVar4 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::val(&this->right_->fadexpr_);
  vVar5 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>
          ::dx(&this->right_->fadexpr_,i);
  return vVar5 * this->left_->val_ + vVar4 * dVar1;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}